

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

void recff_ffi_copy(jit_State *J,RecordFFData *rd)

{
  uint sp;
  TRef *pTVar1;
  TRef trdst;
  TRef trsrc;
  TRef TVar2;
  TRef TVar3;
  long *plVar4;
  
  pTVar1 = J->base;
  sp = pTVar1[1];
  if ((sp != 0 && *pTVar1 != 0) && (TVar2 = pTVar1[2], (sp & 0x1f000000) == 0x4000000 || TVar2 != 0)
     ) {
    plVar4 = (long *)(ulong)J[-1].bpropcache[0xc].mode;
    trdst = crec_ct_tv(J,(CType *)(*plVar4 + 0x110),0,*pTVar1,rd->argv);
    trsrc = crec_ct_tv(J,(CType *)(*plVar4 + 0x120),0,sp,rd->argv + 1);
    if (TVar2 == 0) {
      (J->fold).ins.field_0.op1 = (IRRef1)J->base[1];
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x44130000;
      TVar2 = lj_opt_fold(J);
      TVar3 = lj_ir_kint(J,1);
      (J->fold).ins.field_0.ot = 0x2913;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
      TVar2 = lj_opt_fold(J);
    }
    else {
      TVar2 = crec_ct_tv(J,(CType *)(*plVar4 + 0x90),0,TVar2,rd->argv + 2);
    }
    rd->nres = 0;
    crec_copy(J,trdst,trsrc,TVar2,(CType *)0x0);
    return;
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_ffi_copy(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  TRef trdst = J->base[0], trsrc = J->base[1], trlen = J->base[2];
  if (trdst && trsrc && (trlen || tref_isstr(trsrc))) {
    trdst = crec_ct_tv(J, ctype_get(cts, CTID_P_VOID), 0, trdst, &rd->argv[0]);
    trsrc = crec_ct_tv(J, ctype_get(cts, CTID_P_CVOID), 0, trsrc, &rd->argv[1]);
    if (trlen) {
      trlen = crec_toint(J, cts, trlen, &rd->argv[2]);
    } else {
      trlen = emitir(IRTI(IR_FLOAD), J->base[1], IRFL_STR_LEN);
      trlen = emitir(IRTI(IR_ADD), trlen, lj_ir_kint(J, 1));
    }
    rd->nres = 0;
    crec_copy(J, trdst, trsrc, trlen, NULL);
  }  /* else: interpreter will throw. */
}